

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QString>::emplace<QLatin1String>
          (QMovableArrayOps<QString> *this,qsizetype i,QLatin1String *args)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  Inserter *in_RDX;
  QString *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QString tmp;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  byte bVar7;
  Inserter *this_00;
  QLatin1StringView in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QArrayDataPointer<QString>::needsDetach((QArrayDataPointer<QString> *)in_RDI);
  if (!(bool)uVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar4 = QArrayDataPointer<QString>::freeSpaceAtEnd
                          ((QArrayDataPointer<QString> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT24(in_stack_ffffffffffffff6c,
                                                            in_stack_ffffffffffffff68)))),
       qVar4 != 0)) {
      QArrayDataPointer<QString>::end((QArrayDataPointer<QString> *)in_RDI);
      QString::QString((QString *)in_RDX,in_stack_ffffffffffffff90);
      in_RDI->displaceTo = (QString *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_00730b31;
    }
    if ((in_RSI == (QString *)0x0) &&
       (qVar4 = QArrayDataPointer<QString>::freeSpaceAtBegin
                          ((QArrayDataPointer<QString> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT24(in_stack_ffffffffffffff6c,
                                                            in_stack_ffffffffffffff68)))),
       qVar4 != 0)) {
      QArrayDataPointer<QString>::begin((QArrayDataPointer<QString> *)0x7309b1);
      QString::QString((QString *)in_RDX,in_stack_ffffffffffffff90);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QString *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_00730b31;
    }
  }
  QString::QString((QString *)in_RDX,in_stack_ffffffffffffff90);
  bVar5 = in_RDI->displaceTo != (QString *)0x0;
  uVar6 = bVar5 && in_RSI == (QString *)0x0;
  uVar3 = (uint)(bVar5 && in_RSI == (QString *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QString>::detachAndGrow
            ((QArrayDataPointer<QString> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QString **)CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff6c,uVar3))),
             (QArrayDataPointer<QString> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QString> *)
                              CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff6c,uVar3
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff58));
    Inserter::insertOne(in_RDI,(QString *)CONCAT17(uVar6,in_stack_ffffffffffffff58));
    Inserter::~Inserter((Inserter *)&stack0xffffffffffffff88);
  }
  else {
    QArrayDataPointer<QString>::begin((QArrayDataPointer<QString> *)0x730ac5);
    QString::QString((QString *)in_RDI,(QString *)CONCAT17(uVar6,in_stack_ffffffffffffff58));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QString *)((long)&(in_RDI->displaceTo->d).d + 1);
  }
  QString::~QString((QString *)0x730b31);
LAB_00730b31:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }